

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::SimpleFieldComparator::CompareWithDifferencer
          (SimpleFieldComparator *this,MessageDifferencer *differencer,Message *message1,
          Message *message2,FieldContext *field_context)

{
  FieldContext *message2_00;
  Message *message1_00;
  Message *this_00;
  LogMessage *pLVar1;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields;
  string_view sVar2;
  LogMessage local_60;
  Voidify local_49;
  Descriptor *local_48;
  Descriptor *descriptor2;
  Descriptor *descriptor1;
  FieldContext *field_context_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *differencer_local;
  SimpleFieldComparator *this_local;
  
  descriptor1 = (Descriptor *)field_context;
  field_context_local = (FieldContext *)message2;
  message2_local = message1;
  message1_local = (Message *)differencer;
  differencer_local = (MessageDifferencer *)this;
  descriptor2 = Message::GetDescriptor(message1);
  local_48 = Message::GetDescriptor((Message *)field_context_local);
  this_00 = message1_local;
  message1_00 = message2_local;
  message2_00 = field_context_local;
  if (descriptor2 == local_48) {
    parent_fields = FieldContext::parent_fields((FieldContext *)descriptor1);
    this_local._7_1_ =
         MessageDifferencer::Compare
                   ((MessageDifferencer *)this_00,message1_00,(Message *)message2_00,0,parent_fields
                   );
  }
  else {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator.cc"
               ,0x90);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [48])"Comparison between two messages with different ");
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [14])"descriptors. ");
    sVar2 = Descriptor::full_name(descriptor2);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [5])" vs ");
    sVar2 = Descriptor::full_name(local_48);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar1);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleFieldComparator::CompareWithDifferencer(
    MessageDifferencer* differencer, const Message& message1,
    const Message& message2, const util::FieldContext* field_context) {
  const Descriptor* descriptor1 = message1.GetDescriptor();
  const Descriptor* descriptor2 = message2.GetDescriptor();
  if (descriptor1 != descriptor2) {
    ABSL_DLOG(FATAL) << "Comparison between two messages with different "
                     << "descriptors. " << descriptor1->full_name() << " vs "
                     << descriptor2->full_name();
    return false;
  }
  return differencer->Compare(message1, message2, false,
                              field_context->parent_fields());
}